

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

int Vec_IntRemove(Vec_Int_t *p,int Entry)

{
  int iVar1;
  int local_20;
  int i;
  int Entry_local;
  Vec_Int_t *p_local;
  
  for (local_20 = 0; (local_20 < p->nSize && (p->pArray[local_20] != Entry));
      local_20 = local_20 + 1) {
  }
  if (local_20 == p->nSize) {
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = local_20;
    if (p->nSize <= local_20) {
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x3dc,"int Vec_IntRemove(Vec_Int_t *, int)");
    }
    while (local_20 = iVar1 + 1, local_20 < p->nSize) {
      p->pArray[iVar1] = p->pArray[local_20];
      iVar1 = local_20;
    }
    p->nSize = p->nSize + -1;
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Vec_IntRemove( Vec_Int_t * p, int Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            break;
    if ( i == p->nSize )
        return 0;
    assert( i < p->nSize );
    for ( i++; i < p->nSize; i++ )
        p->pArray[i-1] = p->pArray[i];
    p->nSize--;
    return 1;
}